

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_init(nk_font *font,float pixel_height,nk_rune fallback_codepoint,nk_font_glyph *glyphs,
                 nk_baked_font *baked_font,nk_handle atlas)

{
  nk_rune *pnVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  nk_rune nVar5;
  nk_rune nVar6;
  undefined4 uVar7;
  nk_font_glyph *pnVar8;
  nk_baked_font baked;
  nk_baked_font *baked_font_local;
  nk_font_glyph *glyphs_local;
  nk_rune fallback_codepoint_local;
  float pixel_height_local;
  nk_font *font_local;
  nk_handle atlas_local;
  
  if (font == (nk_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x32d2,
                  "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                 );
  }
  if (glyphs == (nk_font_glyph *)0x0) {
    __assert_fail("glyphs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x32d3,
                  "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                 );
  }
  if (baked_font == (nk_baked_font *)0x0) {
    __assert_fail("baked_font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x32d4,
                  "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                 );
  }
  if (((font != (nk_font *)0x0) && (glyphs != (nk_font_glyph *)0x0)) &&
     (baked_font != (nk_baked_font *)0x0)) {
    fVar2 = baked_font->height;
    fVar3 = baked_font->ascent;
    fVar4 = baked_font->descent;
    nVar5 = baked_font->glyph_offset;
    nVar6 = baked_font->glyph_count;
    uVar7 = *(undefined4 *)&baked_font->field_0x14;
    pnVar1 = baked_font->ranges;
    font->fallback = (nk_font_glyph *)0x0;
    (font->info).height = fVar2;
    (font->info).ascent = fVar3;
    (font->info).descent = fVar4;
    (font->info).glyph_offset = nVar5;
    (font->info).glyph_count = nVar6;
    *(undefined4 *)&(font->info).field_0x14 = uVar7;
    (font->info).ranges = pnVar1;
    font->scale = pixel_height / (font->info).height;
    font->glyphs = glyphs + baked_font->glyph_offset;
    font->texture = atlas;
    font->fallback_codepoint = fallback_codepoint;
    pnVar8 = nk_font_find_glyph(font,fallback_codepoint);
    font->fallback = pnVar8;
    (font->handle).height = (font->info).height * font->scale;
    (font->handle).width = nk_font_text_width;
    (font->handle).userdata.ptr = font;
    (font->handle).query = nk_font_query_font_glyph;
    (font->handle).texture = font->texture;
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_init(struct nk_font *font, float pixel_height,
    nk_rune fallback_codepoint, struct nk_font_glyph *glyphs,
    const struct nk_baked_font *baked_font, nk_handle atlas)
{
    struct nk_baked_font baked;
    NK_ASSERT(font);
    NK_ASSERT(glyphs);
    NK_ASSERT(baked_font);
    if (!font || !glyphs || !baked_font)
        return;

    baked = *baked_font;
    font->fallback = 0;
    font->info = baked;
    font->scale = (float)pixel_height / (float)font->info.height;
    font->glyphs = &glyphs[baked_font->glyph_offset];
    font->texture = atlas;
    font->fallback_codepoint = fallback_codepoint;
    font->fallback = nk_font_find_glyph(font, fallback_codepoint);

    font->handle.height = font->info.height * font->scale;
    font->handle.width = nk_font_text_width;
    font->handle.userdata.ptr = font;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    font->handle.query = nk_font_query_font_glyph;
    font->handle.texture = font->texture;
#endif
}